

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGsContainer.cpp
# Opt level: O3

void __thiscall CFGsContainer::processCFGs(CFGsContainer *this)

{
  bool indirect;
  Type TVar1;
  pointer pcVar2;
  Addr AVar3;
  _Alloc_hider _Var4;
  ulong addr_00;
  CFG *pCVar5;
  mapped_type *ppCVar6;
  BlockData *this_00;
  CfgNode *pCVar7;
  Instruction *instr;
  _Rb_tree_header *p_Var8;
  CFG *pCVar9;
  _Rb_tree_header *p_Var10;
  CfgNode *this_01;
  Data *data;
  _Base_ptr p_Var11;
  int iVar12;
  Addr addr;
  Addr addr_1;
  string local_70;
  _Rb_tree_header *local_50;
  map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
  *local_48;
  ulong local_40;
  CfgNode *local_38;
  
  if ((this->m_currentToken).type == TKN_BRACKET_OPEN) {
    local_50 = &(this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header;
    local_48 = &this->m_cfgsMap;
    do {
      matchToken(this,TKN_BRACKET_OPEN);
      TVar1 = (this->m_currentToken).type;
      while ((uint)(TVar1 + ~TKN_ARROW) < 2) {
        if (TVar1 == TKN_CFG) {
          matchToken(this,TKN_CFG);
          local_40 = (this->m_currentToken).data.addr;
          matchToken(this,TKN_ADDR);
          if ((this->m_currentToken).type == TKN_COLON) {
            matchToken(this,TKN_COLON);
            matchToken(this,TKN_NUMBER);
          }
          addr_00 = local_40;
          p_Var11 = (this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = local_50;
          if (p_Var11 == (_Base_ptr)0x0) {
LAB_00106e7a:
            pCVar5 = (CFG *)operator_new(0x80);
            CFG::CFG(pCVar5,addr_00);
            ppCVar6 = std::
                      map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                      ::operator[](local_48,&local_40);
            *ppCVar6 = pCVar5;
          }
          else {
            do {
              if (*(ulong *)(p_Var11 + 1) >= local_40) {
                p_Var10 = (_Rb_tree_header *)p_Var11;
              }
              p_Var11 = (&p_Var11->_M_left)[*(ulong *)(p_Var11 + 1) < local_40];
            } while (p_Var11 != (_Base_ptr)0x0);
            if (((p_Var10 == local_50) || (local_40 < p_Var10->_M_node_count)) ||
               (pCVar5 = *(CFG **)(p_Var10 + 1), pCVar5 == (CFG *)0x0)) goto LAB_00106e7a;
          }
          pcVar2 = (this->m_currentToken).token._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar2,
                     pcVar2 + (this->m_currentToken).token._M_string_length);
          matchToken(this,TKN_TEXT);
          CFG::setFunctionName(pCVar5,&local_70);
          matchToken(this,TKN_BOOL);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
        }
        else {
          matchToken(this,TKN_NODE);
          local_70._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
          matchToken(this,TKN_ADDR);
          p_Var10 = local_50;
          p_Var11 = (this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var8 = local_50;
          if (p_Var11 == (_Base_ptr)0x0) {
LAB_00107472:
            __assert_fail("cfg != 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                          ,0x14b,"void CFGsContainer::processCFGs()");
          }
          do {
            if (*(pointer *)(p_Var11 + 1) >= local_70._M_dataplus._M_p) {
              p_Var8 = (_Rb_tree_header *)p_Var11;
            }
            p_Var11 = (&p_Var11->_M_left)[*(pointer *)(p_Var11 + 1) < local_70._M_dataplus._M_p];
          } while (p_Var11 != (_Base_ptr)0x0);
          if (((p_Var8 == local_50) || (local_70._M_dataplus._M_p < (pointer)p_Var8->_M_node_count))
             || (pCVar5 = *(CFG **)(p_Var8 + 1), pCVar5 == (CFG *)0x0)) goto LAB_00107472;
          local_70._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
          matchToken(this,TKN_ADDR);
          this_00 = (BlockData *)operator_new(0x90);
          (this_00->super_Data).m_addr = (Addr)local_70._M_dataplus._M_p;
          (this_00->super_Data)._vptr_Data = (_func_int **)&PTR__BlockData_00117a78;
          this_00->m_size = 0;
          this_00->m_indirection = false;
          (this_00->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>.
          _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this_00->m_instrs;
          (this_00->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>.
          _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this_00->m_instrs;
          (this_00->m_instrs).super__List_base<Instruction_*,_std::allocator<Instruction_*>_>.
          _M_impl._M_node._M_size = 0;
          p_Var8 = &(this_00->m_calls)._M_t._M_impl.super__Rb_tree_header;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
          ;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var8->_M_header;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var8->_M_header;
          (this_00->m_calls)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          p_Var8 = &(this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
          ;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
               (_Base_ptr)0x0;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &p_Var8->_M_header;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               &p_Var8->_M_header;
          (this_00->m_signalHandlers)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          pCVar7 = CFG::nodeByAddr(pCVar5,(Addr)local_70._M_dataplus._M_p);
          if (pCVar7 == (CfgNode *)0x0) {
            pCVar7 = (CfgNode *)operator_new(0x78);
            CfgNode::CfgNode(pCVar7,CFG_BLOCK);
            CfgNode::setData(pCVar7,(Data *)this_00);
            CFG::addNode(pCVar5,pCVar7);
          }
          else {
            if (pCVar7->m_type != CFG_PHANTOM) {
              __assert_fail("block->type() == CfgNode::CFG_PHANTOM",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cmpcfgs/src/CFGsContainer.cpp"
                            ,0x153,"void CFGsContainer::processCFGs()");
            }
            CfgNode::setData(pCVar7,(Data *)this_00);
          }
          local_38 = pCVar7;
          matchToken(this,TKN_NUMBER);
          matchToken(this,TKN_BRACKET_OPEN);
          while ((this->m_currentToken).type == TKN_NUMBER) {
            AVar3 = (this->m_currentToken).data.addr;
            matchToken(this,TKN_NUMBER);
            iVar12 = (int)AVar3;
            instr = Instruction::get((Addr)local_70._M_dataplus._M_p,iVar12);
            CfgNode::BlockData::addInstruction(this_00,instr);
            local_70._M_dataplus._M_p = local_70._M_dataplus._M_p + iVar12;
          }
          matchToken(this,TKN_BRACKET_CLOSE);
          matchToken(this,TKN_BRACKET_OPEN);
          while ((this->m_currentToken).type == TKN_ADDR) {
            local_70._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
            matchToken(this,TKN_ADDR);
            if ((this->m_currentToken).type == TKN_COLON) {
              matchToken(this,TKN_COLON);
              matchToken(this,TKN_NUMBER);
            }
            _Var4._M_p = local_70._M_dataplus._M_p;
            p_Var11 = (this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var8 = p_Var10;
            if (p_Var11 == (_Base_ptr)0x0) {
LAB_00107158:
              pCVar9 = (CFG *)operator_new(0x80);
              CFG::CFG(pCVar9,(Addr)_Var4._M_p);
              ppCVar6 = std::
                        map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                        ::operator[](local_48,(key_type *)&local_70);
              *ppCVar6 = pCVar9;
            }
            else {
              do {
                if (*(pointer *)(p_Var11 + 1) >= local_70._M_dataplus._M_p) {
                  p_Var8 = (_Rb_tree_header *)p_Var11;
                }
                p_Var11 = (&p_Var11->_M_left)[*(pointer *)(p_Var11 + 1) < local_70._M_dataplus._M_p]
                ;
              } while (p_Var11 != (_Base_ptr)0x0);
              if (((p_Var8 == p_Var10) ||
                  (local_70._M_dataplus._M_p < (pointer)p_Var8->_M_node_count)) ||
                 (pCVar9 = *(CFG **)(p_Var8 + 1), pCVar9 == (CFG *)0x0)) goto LAB_00107158;
            }
            CfgNode::BlockData::addCall(this_00,pCVar9);
          }
          matchToken(this,TKN_BRACKET_CLOSE);
          matchToken(this,TKN_BRACKET_OPEN);
          while ((this->m_currentToken).type == TKN_NUMBER) {
            iVar12 = *(int *)&(this->m_currentToken).data;
            matchToken(this,TKN_NUMBER);
            matchToken(this,TKN_ARROW);
            local_70._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
            matchToken(this,TKN_ADDR);
            if ((this->m_currentToken).type == TKN_COLON) {
              matchToken(this,TKN_COLON);
              matchToken(this,TKN_NUMBER);
            }
            _Var4._M_p = local_70._M_dataplus._M_p;
            p_Var11 = (this->m_cfgsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var10 = local_50;
            if (p_Var11 == (_Base_ptr)0x0) {
LAB_0010725a:
              pCVar9 = (CFG *)operator_new(0x80);
              CFG::CFG(pCVar9,(Addr)_Var4._M_p);
              ppCVar6 = std::
                        map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
                        ::operator[](local_48,(key_type *)&local_70);
              *ppCVar6 = pCVar9;
            }
            else {
              do {
                if (*(pointer *)(p_Var11 + 1) >= local_70._M_dataplus._M_p) {
                  p_Var10 = (_Rb_tree_header *)p_Var11;
                }
                p_Var11 = (&p_Var11->_M_left)[*(pointer *)(p_Var11 + 1) < local_70._M_dataplus._M_p]
                ;
              } while (p_Var11 != (_Base_ptr)0x0);
              if (((p_Var10 == local_50) ||
                  (local_70._M_dataplus._M_p < (pointer)p_Var10->_M_node_count)) ||
                 (pCVar9 = *(CFG **)(p_Var10 + 1), pCVar9 == (CFG *)0x0)) goto LAB_0010725a;
            }
            CfgNode::BlockData::addSignalHandler(this_00,iVar12,pCVar9);
          }
          matchToken(this,TKN_BRACKET_CLOSE);
          indirect = (this->m_currentToken).data.boolean;
          matchToken(this,TKN_BOOL);
          CfgNode::BlockData::setIndirect(this_00,indirect);
          matchToken(this,TKN_BRACKET_OPEN);
          pCVar7 = local_38;
          TVar1 = (this->m_currentToken).type;
          while ((uint)(TVar1 + ~TKN_NODE) < 3) {
            if (TVar1 == TKN_EXIT) {
              matchToken(this,TKN_EXIT);
              this_01 = pCVar5->m_exitNode;
              if (this_01 == (CfgNode *)0x0) {
                this_01 = (CfgNode *)operator_new(0x78);
                CfgNode::CfgNode(this_01,CFG_EXIT);
                goto LAB_001073d7;
              }
            }
            else if (TVar1 == TKN_HALT) {
              matchToken(this,TKN_HALT);
              this_01 = pCVar5->m_haltNode;
              if (this_01 == (CfgNode *)0x0) {
                this_01 = (CfgNode *)operator_new(0x78);
                CfgNode::CfgNode(this_01,CFG_HALT);
LAB_001073d7:
                CFG::addNode(pCVar5,this_01);
              }
            }
            else {
              local_70._M_dataplus._M_p = (pointer)(this->m_currentToken).data.addr;
              matchToken(this,TKN_ADDR);
              this_01 = CFG::nodeByAddr(pCVar5,(Addr)local_70._M_dataplus._M_p);
              if (this_01 == (CfgNode *)0x0) {
                data = (Data *)operator_new(0x10);
                data->m_addr = (Addr)local_70._M_dataplus._M_p;
                data->_vptr_Data = (_func_int **)&PTR__Data_00117ac0;
                this_01 = (CfgNode *)operator_new(0x78);
                CfgNode::CfgNode(this_01,CFG_PHANTOM);
                CfgNode::setData(this_01,data);
                goto LAB_001073d7;
              }
            }
            if ((this->m_currentToken).type == TKN_COLON) {
              matchToken(this,TKN_COLON);
              matchToken(this,TKN_NUMBER);
            }
            CFG::addEdge(pCVar5,pCVar7,this_01);
            TVar1 = (this->m_currentToken).type;
          }
          matchToken(this,TKN_BRACKET_CLOSE);
        }
        TVar1 = (this->m_currentToken).type;
      }
      matchToken(this,TKN_BRACKET_CLOSE);
    } while ((this->m_currentToken).type == TKN_BRACKET_OPEN);
  }
  return;
}

Assistant:

void CFGsContainer::processCFGs() {
	while (m_currentToken.type == Lexeme::TKN_BRACKET_OPEN) {
		matchToken(Lexeme::TKN_BRACKET_OPEN);

		while (m_currentToken.type == Lexeme::TKN_CFG ||
			   m_currentToken.type == Lexeme::TKN_NODE) {
			switch (m_currentToken.type) {
				case Lexeme::TKN_CFG:
				{
					matchToken(Lexeme::TKN_CFG);

					Addr addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					if (m_currentToken.type == Lexeme::TKN_COLON) {
						matchToken(Lexeme::TKN_COLON);
						matchToken(Lexeme::TKN_NUMBER);
					}

					CFG* cfg = this->cfg(addr);
					if (!cfg) {
						cfg = new CFG(addr);
						m_cfgsMap[addr] = cfg;
					}

					std::string name = m_currentToken.token;
					matchToken(Lexeme::TKN_TEXT);
					cfg->setFunctionName(name);

					bool complete = m_currentToken.data.boolean;
					matchToken(Lexeme::TKN_BOOL);
					(void) complete;

					break;
				}
				case Lexeme::TKN_NODE:
				{
					matchToken(Lexeme::TKN_NODE);

					Addr addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					CFG* cfg = this->cfg(addr);
					assert(cfg != 0);

					addr = m_currentToken.data.addr;
					matchToken(Lexeme::TKN_ADDR);

					CfgNode::BlockData* blockData = new CfgNode::BlockData(addr);
					CfgNode* block = cfg->nodeByAddr(addr);
					if (block) {
						assert(block->type() == CfgNode::CFG_PHANTOM);
						block->setData(blockData);
					} else {
						block = new CfgNode(CfgNode::CFG_BLOCK);
						block->setData(blockData);
						cfg->addNode(block);
					}

					int block_size = m_currentToken.data.number;
					matchToken(Lexeme::TKN_NUMBER);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_NUMBER) {
						int instr_size = m_currentToken.data.number;
						matchToken(Lexeme::TKN_NUMBER);

						blockData->addInstruction(Instruction::get(addr, instr_size));
						addr += instr_size;
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					// assert((addr - blockData->addr()) == block_size);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_ADDR) {
						addr = m_currentToken.data.addr;
						matchToken(Lexeme::TKN_ADDR);

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						CFG* call = this->cfg(addr);
						if (!call) {
							call = new CFG(addr);
							m_cfgsMap[addr] = call;
						}

						blockData->addCall(call);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_NUMBER) {
						int sigid = m_currentToken.data.number;
						matchToken(Lexeme::TKN_NUMBER);

						matchToken(Lexeme::TKN_ARROW);

						addr = m_currentToken.data.addr;
						matchToken(Lexeme::TKN_ADDR);

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						CFG* handler = this->cfg(addr);
						if (!handler) {
							handler = new CFG(addr);
							m_cfgsMap[addr] = handler;
						}

						blockData->addSignalHandler(sigid, handler);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					bool indirection = m_currentToken.data.boolean;
					matchToken(Lexeme::TKN_BOOL);

					blockData->setIndirect(indirection);

					matchToken(Lexeme::TKN_BRACKET_OPEN);
					while (m_currentToken.type == Lexeme::TKN_ADDR ||
						   m_currentToken.type == Lexeme::TKN_EXIT ||
						   m_currentToken.type == Lexeme::TKN_HALT) {
						CfgNode* succ;
						switch (m_currentToken.type) {
							case Lexeme::TKN_ADDR:
								addr = m_currentToken.data.addr;
								matchToken(Lexeme::TKN_ADDR);

								if (!(succ = cfg->nodeByAddr(addr))) {
									CfgNode::PhantomData* phantomData =
											new CfgNode::PhantomData(addr);

									succ = new CfgNode(CfgNode::CFG_PHANTOM);
									succ->setData(phantomData);

									cfg->addNode(succ);
								}

								break;
							case Lexeme::TKN_EXIT:
								matchToken(Lexeme::TKN_EXIT);

								succ = cfg->exitNode();
								if (!succ) {
									succ = new CfgNode(CfgNode::CFG_EXIT);
									cfg->addNode(succ);
								}

								break;
							case Lexeme::TKN_HALT:
								matchToken(Lexeme::TKN_HALT);

								succ = cfg->haltNode();
								if (!succ) {
									succ = new CfgNode(CfgNode::CFG_HALT);
									cfg->addNode(succ);
								}

								break;
							default:
								assert(false);
						}

						if (m_currentToken.type == Lexeme::TKN_COLON) {
							matchToken(Lexeme::TKN_COLON);
							matchToken(Lexeme::TKN_NUMBER);
						}

						cfg->addEdge(block, succ);
					}
					matchToken(Lexeme::TKN_BRACKET_CLOSE);

					break;
				}
				default:
					assert(false);
			}
		}

		matchToken(Lexeme::TKN_BRACKET_CLOSE);
	}
}